

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaopen_io(lua_State *L)

{
  TValue *pTVar1;
  StkId pTVar2;
  int idx;
  
  lua_getfield(L,-10000,"FILE*");
  pTVar1 = L->top + -1;
  if ((pTVar1 != &luaO_nilobject_) && (L->top[-1].tt == 0)) {
    L->top = pTVar1;
    lua_createtable(L,0,0x114420);
    pTVar2 = L->top;
    pTVar2->value = pTVar2[-1].value;
    pTVar2->tt = pTVar2[-1].tt;
    L->top = L->top + 1;
    lua_setfield(L,-10000,"FILE*");
  }
  pTVar2 = L->top;
  pTVar2->value = pTVar2[-1].value;
  pTVar2->tt = pTVar2[-1].tt;
  L->top = L->top + 1;
  lua_setfield(L,-2,"__index");
  luaL_register(L,(char *)0x0,flib);
  newfenv(L,io_fclose);
  lua_replace(L,-0x2711);
  luaL_register(L,"io",iolib);
  newfenv(L,io_noclose);
  createstdfile(L,_stdin,1,"stdin");
  createstdfile(L,_stdout,2,"stdout");
  createstdfile(L,_stderr,0,"stderr");
  L->top = L->top + -1;
  lua_getfield(L,-1,"popen");
  idx = 0x110cde;
  newfenv(L,io_pclose);
  lua_setfenv(L,idx);
  L->top = L->top + -1;
  return 1;
}

Assistant:

static int luaopen_io(lua_State*L){
createmeta(L);
newfenv(L,io_fclose);
lua_replace(L,(-10001));
luaL_register(L,"io",iolib);
newfenv(L,io_noclose);
createstdfile(L,stdin,1,"stdin");
createstdfile(L,stdout,2,"stdout");
createstdfile(L,stderr,0,"stderr");
lua_pop(L,1);
lua_getfield(L,-1,"popen");
newfenv(L,io_pclose);
lua_setfenv(L,-2);
lua_pop(L,1);
return 1;
}